

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event_finder.cpp
# Opt level: O0

void __thiscall sc_core::sc_event_finder::report_error(sc_event_finder *this,char *id,char *add_msg)

{
  ostream *poVar1;
  char *pcVar2;
  char *in_RDX;
  long in_RDI;
  stringstream msg;
  string local_1d0 [36];
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  ostream local_190 [4];
  sc_severity in_stack_fffffffffffffe74;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe60);
  if (in_RDX != (char *)0x0) {
    poVar1 = std::operator<<(local_190,in_RDX);
    std::operator<<(poVar1,": ");
  }
  poVar1 = std::operator<<(local_190,"port \'");
  pcVar2 = sc_object::name((sc_object *)0x222404);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\' (");
  pcVar2 = (char *)(**(code **)(**(long **)(in_RDI + 8) + 0x18))();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  sc_report_handler::report
            (in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe60);
  return;
}

Assistant:

void
sc_event_finder::report_error( const char* id, const char* add_msg ) const
{
    std::stringstream msg;
    if (add_msg != 0)
        msg << add_msg << ": ";
    msg << "port '" << m_port.name() << "' (" << m_port.kind() << ")";
    SC_REPORT_ERROR( id, msg.str().c_str() );
}